

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O0

void __thiscall DbCheckPostLower::Check(DbCheckPostLower *this,Opnd *opnd)

{
  uint uVar1;
  int iVar2;
  code *pcVar3;
  bool bVar4;
  IRType IVar5;
  IndirOpnd *pIVar6;
  RegOpnd *pRVar7;
  ListOpnd *this_00;
  SymOpnd *pSVar8;
  StackSym *pSVar9;
  undefined4 *puVar10;
  uint *puVar11;
  uint symSize;
  IRType symType;
  Opnd *opnd_local;
  DbCheckPostLower *this_local;
  
  if (opnd != (Opnd *)0x0) {
    bVar4 = IR::Opnd::IsRegOpnd(opnd);
    if (bVar4) {
      pRVar7 = IR::Opnd::AsRegOpnd(opnd);
      Check(this,pRVar7);
    }
    else {
      bVar4 = IR::Opnd::IsIndirOpnd(opnd);
      if (bVar4) {
        pIVar6 = IR::Opnd::AsIndirOpnd(opnd);
        pRVar7 = IR::IndirOpnd::GetBaseOpnd(pIVar6);
        Check(this,pRVar7);
        pIVar6 = IR::Opnd::AsIndirOpnd(opnd);
        pRVar7 = IR::IndirOpnd::GetIndexOpnd(pIVar6);
        Check(this,pRVar7);
      }
      else {
        bVar4 = IR::Opnd::IsListOpnd(opnd);
        if (bVar4) {
          this_00 = IR::Opnd::AsListOpnd(opnd);
          IR::ListOpnd::Map<DbCheckPostLower::Check(IR::Opnd*)::__0>
                    (this_00,(anon_class_8_1_8991fb9c)this);
        }
        else {
          bVar4 = IR::Opnd::IsSymOpnd(opnd);
          if (bVar4) {
            pSVar8 = IR::Opnd::AsSymOpnd(opnd);
            bVar4 = Sym::IsStackSym(pSVar8->m_sym);
            if (bVar4) {
              if ((*(uint *)&this->func->field_0x240 >> 0x16 & 1) != 0) {
                pSVar8 = IR::Opnd::AsSymOpnd(opnd);
                pSVar9 = Sym::AsStackSym(pSVar8->m_sym);
                bVar4 = StackSym::IsAllocated(pSVar9);
                if (!bVar4) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar10 = 1;
                  bVar4 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                                     ,0xe9,"(opnd->AsSymOpnd()->m_sym->AsStackSym()->IsAllocated())"
                                     ,"No Stack space allocated for StackSym?");
                  if (!bVar4) {
                    pcVar3 = (code *)invalidInstructionException();
                    (*pcVar3)();
                  }
                  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar10 = 0;
                }
              }
              pSVar8 = IR::Opnd::AsSymOpnd(opnd);
              pSVar9 = Sym::AsStackSym(pSVar8->m_sym);
              IVar5 = StackSym::GetType(pSVar9);
              if (IVar5 != TyMisc) {
                puVar11 = (uint *)max<int>(TySize + IVar5,&MachRegInt);
                uVar1 = *puVar11;
                pSVar8 = IR::Opnd::AsSymOpnd(opnd);
                IVar5 = IR::Opnd::GetType(&pSVar8->super_Opnd);
                iVar2 = TySize[IVar5];
                pSVar8 = IR::Opnd::AsSymOpnd(opnd);
                if (uVar1 < iVar2 + pSVar8->m_offset) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar10 = 1;
                  bVar4 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                                     ,0xef,
                                     "(static_cast<uint>(TySize[opnd->AsSymOpnd()->GetType()]) + opnd->AsSymOpnd()->m_offset <= symSize)"
                                     ,"SymOpnd cannot refer to a size greater than Sym\'s reference"
                                    );
                  if (!bVar4) {
                    pcVar3 = (code *)invalidInstructionException();
                    (*pcVar3)();
                  }
                  puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar10 = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void DbCheckPostLower::Check(IR::Opnd *opnd)
{
    if (opnd == NULL)
    {
        return;
    }

    if (opnd->IsRegOpnd())
    {
        this->Check(opnd->AsRegOpnd());
    }
    else if (opnd->IsIndirOpnd())
    {
        this->Check(opnd->AsIndirOpnd()->GetBaseOpnd());
        this->Check(opnd->AsIndirOpnd()->GetIndexOpnd());
    }
    else if (opnd->IsListOpnd())
    {
        opnd->AsListOpnd()->Map([&](int i, IR::Opnd* opnd) { this->Check(opnd); });
    }
    else if (opnd->IsSymOpnd() && opnd->AsSymOpnd()->m_sym->IsStackSym())
    {
        if (this->func->isPostRegAlloc)
        {
            AssertMsg(opnd->AsSymOpnd()->m_sym->AsStackSym()->IsAllocated(), "No Stack space allocated for StackSym?");
        }
        IRType symType = opnd->AsSymOpnd()->m_sym->AsStackSym()->GetType();
        if (symType != TyMisc)
        {
            uint symSize = static_cast<uint>(max(TySize[symType], MachRegInt));
            AssertMsg(static_cast<uint>(TySize[opnd->AsSymOpnd()->GetType()]) + opnd->AsSymOpnd()->m_offset <= symSize, "SymOpnd cannot refer to a size greater than Sym's reference");
        }
    }
}